

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

Map_CutTable_t * Map_CutTableStart(Map_Man_t *pMan)

{
  int iVar1;
  Map_CutTable_t *__s;
  Map_Cut_t **ppMVar2;
  int *piVar3;
  Map_CutTable_t *p;
  Map_Man_t *pMan_local;
  
  __s = (Map_CutTable_t *)malloc(0x38);
  memset(__s,0,0x38);
  iVar1 = Abc_PrimeCudd(10000);
  __s->nBins = iVar1;
  ppMVar2 = (Map_Cut_t **)malloc((long)__s->nBins << 3);
  __s->pBins = ppMVar2;
  memset(__s->pBins,0,(long)__s->nBins << 3);
  piVar3 = (int *)malloc(8000);
  __s->pCuts = piVar3;
  ppMVar2 = (Map_Cut_t **)malloc(16000);
  __s->pArray = ppMVar2;
  ppMVar2 = (Map_Cut_t **)malloc(16000);
  __s->pCuts1 = ppMVar2;
  ppMVar2 = (Map_Cut_t **)malloc(16000);
  __s->pCuts2 = ppMVar2;
  return __s;
}

Assistant:

Map_CutTable_t * Map_CutTableStart( Map_Man_t * pMan )
{
    Map_CutTable_t * p;
    // allocate the table
    p = ABC_ALLOC( Map_CutTable_t, 1 );
    memset( p, 0, sizeof(Map_CutTable_t) );
    p->nBins = Abc_PrimeCudd( 10 * MAP_CUTS_MAX_COMPUTE );
    p->pBins = ABC_ALLOC( Map_Cut_t *, p->nBins );
    memset( p->pBins, 0, sizeof(Map_Cut_t *) * p->nBins );
    p->pCuts = ABC_ALLOC( int, 2 * MAP_CUTS_MAX_COMPUTE );
    p->pArray = ABC_ALLOC( Map_Cut_t *, 2 * MAP_CUTS_MAX_COMPUTE );
    p->pCuts1 = ABC_ALLOC( Map_Cut_t *, 2 * MAP_CUTS_MAX_COMPUTE );
    p->pCuts2 = ABC_ALLOC( Map_Cut_t *, 2 * MAP_CUTS_MAX_COMPUTE );
    return p;
}